

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::benchmarkStarting(XmlReporter *this,BenchmarkInfo *info)

{
  XmlWriter *pXVar1;
  allocator<char> local_de;
  allocator<char> local_dd;
  allocator<char> local_dc;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"samples",&local_d9);
  pXVar1 = XmlWriter::writeAttribute<int>(&this->m_xml,&local_38,&info->samples);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"resamples",&local_da);
  pXVar1 = XmlWriter::writeAttribute<unsigned_int>(pXVar1,&local_58,&info->resamples);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"iterations",&local_db);
  pXVar1 = XmlWriter::writeAttribute<int>(pXVar1,&local_78,&info->iterations);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"clockResolution",&local_dc);
  pXVar1 = XmlWriter::writeAttribute<double>(pXVar1,&local_98,&info->clockResolution);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"estimatedDuration",&local_dd);
  pXVar1 = XmlWriter::writeAttribute<double>(pXVar1,&local_b8,&info->estimatedDuration);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"All values in nano seconds",&local_de);
  XmlWriter::writeComment(pXVar1,&local_d8,Newline|Indent);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void XmlReporter::benchmarkStarting(BenchmarkInfo const &info) {
        m_xml.writeAttribute("samples", info.samples)
            .writeAttribute("resamples", info.resamples)
            .writeAttribute("iterations", info.iterations)
            .writeAttribute("clockResolution", info.clockResolution)
            .writeAttribute("estimatedDuration", info.estimatedDuration)
            .writeComment("All values in nano seconds");
    }